

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_dec
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  int iVar1;
  buffer_appender<char> bVar2;
  int num_digits;
  ulong uVar3;
  ulong uVar4;
  string_view prefix;
  undefined1 auVar5 [16];
  undefined4 uStack_34;
  
  auVar5 = (undefined1  [16])this->abs_value;
  num_digits = 1;
  if ((ulong)((ulong)this->abs_value < 10) <= *(ulong *)((long)&this->abs_value + 8)) {
    iVar1 = 4;
    do {
      num_digits = iVar1;
      uVar4 = auVar5._8_8_;
      uVar3 = auVar5._0_8_;
      if (uVar4 == 0 && (ulong)(99 < uVar3) <= -uVar4) {
        num_digits = num_digits + -2;
        goto LAB_001553d3;
      }
      if (uVar4 == 0 && (ulong)(999 < uVar3) <= -uVar4) {
        num_digits = num_digits + -1;
        goto LAB_001553d3;
      }
      if (uVar4 < (uVar3 < 10000)) goto LAB_001553d3;
      auVar5 = __udivti3(uVar3,uVar4,10000,0);
      iVar1 = num_digits + 4;
    } while (uVar4 != 0 || -uVar4 < (ulong)(99999 < uVar3));
    num_digits = num_digits + 1;
  }
LAB_001553d3:
  f._12_4_ = uStack_34;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar2 = write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_dec()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)
                     (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                     container,num_digits,prefix,this->specs,f);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }